

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void http_rd_start(nni_http_conn *conn)

{
  nni_aio *aio;
  size_t *psVar1;
  uint8_t *__dest;
  ulong uVar2;
  bool bVar3;
  nng_err result;
  nni_aio *aio_00;
  size_t sVar4;
  nni_http_chunks *cl;
  size_t sVar5;
  nni_iov *iov_00;
  nng_http_status status;
  uint nio_00;
  ulong n;
  uint8_t *buf;
  nni_iov *local_50;
  nni_iov *iov;
  ulong local_40;
  uint local_34 [2];
  uint nio;
  
  psVar1 = &conn->rd_get;
  aio = &conn->rd_aio;
  do {
    aio_00 = conn->rd_uaio;
    if (aio_00 == (nni_aio *)0x0) {
      aio_00 = (nni_aio *)nni_list_first(&conn->rdq);
      if (aio_00 == (nni_aio *)0x0) {
        return;
      }
      nni_list_remove(&conn->rdq,aio_00);
      conn->rd_uaio = aio_00;
    }
    result = NNG_ECLOSED;
    if (conn->closed != false) goto LAB_0013bb8b;
    if (HTTP_RD_DISCARD < conn->rd_flavor) {
      result = NNG_EINVAL;
      goto LAB_0013bb8b;
    }
    sVar4 = conn->rd_get;
    n = conn->rd_put - sVar4;
    __dest = conn->buf;
    buf = __dest + sVar4;
    switch(conn->rd_flavor) {
    case HTTP_RD_RAW:
      bVar3 = true;
      goto LAB_0013be94;
    case HTTP_RD_FULL:
      bVar3 = false;
LAB_0013be94:
      nni_aio_get_iov(aio_00,local_34,&stack0xffffffffffffffb0);
      if (n != 0 && local_34[0] != 0) {
        do {
          local_40 = local_50->iov_len;
          if (n <= local_50->iov_len) {
            local_40 = n;
          }
          memcpy(local_50->iov_buf,buf,local_40);
          uVar2 = local_40;
          local_50->iov_len = local_50->iov_len - local_40;
          local_50->iov_buf = (void *)((long)local_50->iov_buf + local_40);
          *psVar1 = *psVar1 + local_40;
          nni_aio_bump_count(aio_00,local_40);
          if (local_50->iov_len == 0) {
            local_34[0] = local_34[0] - 1;
            local_50 = local_50 + 1;
          }
          if (local_34[0] == 0) break;
          buf = buf + uVar2;
          n = n - local_40;
        } while (n != 0);
      }
      nni_aio_set_iov(aio_00,local_34[0],local_50);
      result = NNG_OK;
      if ((local_34[0] != 0) && ((!bVar3 || (sVar4 = nni_aio_count(aio_00), sVar4 == 0)))) {
        conn->buffered = false;
        iov_00 = local_50;
        nio_00 = local_34[0];
LAB_0013c001:
        nni_aio_set_iov(aio,nio_00,iov_00);
        nng_stream_recv(conn->sock,aio);
        result = NNG_EAGAIN;
      }
      break;
    case HTTP_RD_REQ:
      conn->client = true;
      result = nni_http_req_parse(conn,buf,n,&local_40);
      conn->client = false;
      sVar4 = conn->rd_get + local_40;
      conn->rd_get = sVar4;
      if (sVar4 == conn->rd_put) {
        *psVar1 = 0;
        conn->rd_put = 0;
      }
      if (result == NNG_EAGAIN) {
        sVar4 = *psVar1;
        if (sVar4 != 0) {
          memmove(conn->buf,conn->buf + sVar4,conn->rd_put - sVar4);
          conn->rd_put = conn->rd_put - conn->rd_get;
          conn->rd_get = 0;
        }
        if (conn->rd_put == conn->bufsz) {
          status = NNG_HTTP_STATUS_URI_TOO_LONG;
          if ((conn->req).data.parsed != false) {
            status = NNG_HTTP_STATUS_HEADERS_TOO_LARGE;
          }
          nng_http_set_status(conn,status,(char *)0x0);
          builtin_memcpy(conn->buf,"NNG-DISCARD: X",0xf);
          conn->rd_get = 0;
          sVar5 = strlen((char *)conn->buf);
          conn->rd_put = sVar5;
        }
LAB_0013bd72:
        local_50 = (nni_iov *)(conn->buf + conn->rd_put);
        iov = (nni_iov *)(conn->bufsz - conn->rd_put);
        conn->buffered = true;
LAB_0013bd9c:
        nni_aio_set_iov(aio,1,(nni_iov *)&stack0xffffffffffffffb0);
        nng_stream_recv(conn->sock,aio);
      }
      break;
    case HTTP_RD_RES:
      conn->client = false;
      result = nni_http_res_parse(conn,buf,n,&local_40);
      conn->client = true;
      sVar4 = conn->rd_get + local_40;
      conn->rd_get = sVar4;
      if (sVar4 == conn->rd_put) {
        *psVar1 = 0;
        conn->rd_put = 0;
      }
      if (result == NNG_EAGAIN) {
        sVar4 = *psVar1;
        if (sVar4 != 0) {
          memmove(conn->buf,conn->buf + sVar4,conn->rd_put - sVar4);
          conn->rd_put = conn->rd_put - conn->rd_get;
          conn->rd_get = 0;
        }
        local_50 = (nni_iov *)(conn->buf + conn->rd_put);
        iov = (nni_iov *)(conn->bufsz - conn->rd_put);
        conn->buffered = true;
        if (iov != (nni_iov *)0x0) goto LAB_0013bd9c;
        result = NNG_EMSGSIZE;
      }
      break;
    case HTTP_RD_CHUNK:
      cl = (nni_http_chunks *)nni_aio_get_prov_data(aio_00);
      result = nni_http_chunks_parse(cl,buf,n,&local_40);
      sVar4 = conn->rd_get + local_40;
      conn->rd_get = sVar4;
      if (sVar4 == conn->rd_put) {
        *psVar1 = 0;
        conn->rd_put = 0;
      }
      if (result == NNG_EAGAIN) goto LAB_0013bd72;
      break;
    case HTTP_RD_DISCARD:
      uVar2 = conn->rd_discard;
      local_40 = n;
      if (uVar2 <= n) {
        local_40 = uVar2;
      }
      sVar4 = local_40 + sVar4;
      conn->rd_get = sVar4;
      conn->rd_discard = uVar2 - local_40;
      if (sVar4 != 0) {
        memmove(__dest,__dest + sVar4,conn->rd_put - sVar4);
        conn->rd_put = conn->rd_put - conn->rd_get;
        conn->rd_get = 0;
      }
      if (conn->rd_discard == 0) {
        result = NNG_OK;
        break;
      }
      local_50 = (nni_iov *)(conn->buf + conn->rd_put);
      iov = (nni_iov *)(conn->bufsz - conn->rd_put);
      conn->buffered = true;
      iov_00 = (nni_iov *)&stack0xffffffffffffffb0;
      nio_00 = 1;
      goto LAB_0013c001;
    }
LAB_0013bb8b:
    if (result == NNG_OK) {
      conn->rd_uaio = (nni_aio *)0x0;
      sVar4 = nni_aio_count(aio_00);
      nni_aio_finish(aio_00,NNG_OK,sVar4);
    }
    else {
      if (result == NNG_EAGAIN) {
        return;
      }
      conn->rd_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(aio_00,result);
      http_close(conn);
    }
  } while( true );
}

Assistant:

static void
http_rd_start(nni_http_conn *conn)
{
	for (;;) {
		nni_aio *aio;
		int      rv;

		if ((aio = conn->rd_uaio) == NULL) {
			if ((aio = nni_list_first(&conn->rdq)) == NULL) {
				// No more stuff waiting for read.
				return;
			}
			nni_list_remove(&conn->rdq, aio);
			conn->rd_uaio = aio;
		}

		if (conn->closed) {
			rv = NNG_ECLOSED;
		} else {
			rv = http_rd_buf(conn, aio);
		}
		switch (rv) {
		case NNG_EAGAIN:
			return;
		case 0:
			conn->rd_uaio = NULL;
			nni_aio_finish(aio, NNG_OK, nni_aio_count(aio));
			break;
		default:
			conn->rd_uaio = NULL;
			nni_aio_finish_error(aio, rv);
			http_close(conn);
			break;
		}
	}
}